

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void guards_follow_suspicious_character(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  bool bVar2;
  mappos8_t *out;
  mappos8_t *pmVar3;
  char *in_RSI;
  tgestate_t *in_RDI;
  uint8_t direction;
  int dir;
  mappos8_t *hero_mappos;
  mappos16_t *mappos;
  mappos8_t *mappos_stash;
  character_t character;
  
  if ((*in_RSI != '\0') && (in_RDI->vischars[0].mi.sprite == sprites + 0x16)) {
    return;
  }
  if (in_RSI[1] == '\x04') {
    return;
  }
  out = &in_RDI->mappos_stash;
  if (in_RDI->room_index == '\0') {
    scale_mappos_down((mappos16_t *)(in_RSI + 0x20),out);
    pmVar3 = &in_RDI->hero_mappos;
    bVar1 = in_RSI[0x1a];
    if ((bVar1 & 1) == 0) {
      if ((int)(uint)(in_RDI->hero_mappos).v <= (int)((in_RDI->mappos_stash).v - 1)) {
        return;
      }
      if ((in_RDI->mappos_stash).v + 1 < (uint)(in_RDI->hero_mappos).v) {
        return;
      }
      bVar2 = out->u < pmVar3->u;
      if ((bVar1 & 2) == 0) {
        bVar2 = !bVar2;
      }
      if (bVar2) {
        return;
      }
    }
    else {
      if ((int)(uint)pmVar3->u <= (int)(out->u - 1)) {
        return;
      }
      if (out->u + 1 < (uint)pmVar3->u) {
        return;
      }
      bVar2 = (in_RDI->mappos_stash).v < (in_RDI->hero_mappos).v;
      if ((bVar1 & 2) == 0) {
        bVar2 = !bVar2;
      }
      if (bVar2) {
        return;
      }
    }
  }
  if (in_RDI->red_flag == '\0') {
    if (*(ushort *)(in_RSI + 0x24) < 0x20) {
      in_RSI[1] = '\x02';
    }
  }
  else {
    in_RDI->bell = '\0';
    hostiles_pursue(in_RDI);
  }
  return;
}

Assistant:

void guards_follow_suspicious_character(tgestate_t *state,
                                        vischar_t  *vischar)
{
  character_t  character;    /* was A */
  mappos8_t   *mappos_stash; /* was DE */
  mappos16_t  *mappos;       /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  /* Conv: Copy of vischar in HL factored out. */

  character = vischar->character;

  /* Wearing the uniform stops anyone but the commandant from pursuing the
   * hero. */
  if (character != character_0_COMMANDANT &&
      state->vischars[0].mi.sprite == &sprites[sprite_GUARD_FACING_AWAY_1])
    return;

  /* If this (hostile) character saw the bribe being used then ignore the
   * hero. */
  if (vischar->flags == vischar_PURSUIT_SAW_BRIBE)
    return;

  /* Do line of sight checking when outdoors. */

  mappos = &vischar->mi.mappos; /* was HL += 15 */
  mappos_stash = &state->mappos_stash; // TODO: Find out if this use of mappos_stash ever intersects with the use of mappos_stash for the mask rendering.
  if (state->room_index == room_0_OUTDOORS)
  {
    mappos8_t *hero_mappos; /* was HL */
    int        dir;         /* Conv: was carry */
    uint8_t    direction;   /* was A / C */

    scale_mappos_down(mappos, mappos_stash); // stash_pos = vischar.mi.pos

    hero_mappos = &state->hero_mappos;
    /* Conv: Dupe pos pointer factored out. */

    direction = vischar->direction; /* This character's direction. */
    /* Conv: Avoided shifting 'direction' here. Propagated shift into later ops. */

    if ((direction & 1) == 0)
    {
      /* TL or BR */

      /* Does the hero approximately match our Y coordinate? */
      if (mappos_stash->v - 1 >= hero_mappos->v ||
          mappos_stash->v + 1 <  hero_mappos->v)
        return;

      /* Are we facing the hero? */
      dir = mappos_stash->u < hero_mappos->u;
      if ((direction & 2) == 0)
        dir = !dir;
      if (dir)
        return;
    }
    else
    {
      /* TR or BL */

      /* Does the hero approximately match our X coordinate? */
      if (mappos_stash->u - 1 >= hero_mappos->u ||
          mappos_stash->u + 1 <  hero_mappos->u)
        return;

      /* Are we facing the hero? */
      dir = mappos_stash->v < hero_mappos->v;
      if ((direction & 2) == 0)
        dir = !dir;
      if (dir)
        return;
    }
  }

  if (!state->red_flag)
  {
    /* Hostiles *not* in guard towers hassle the hero. */
    if (vischar->mi.mappos.w < 32) /* uses A as temporary */
      vischar->flags = vischar_PURSUIT_HASSLE;
  }
  else
  {
    state->bell = bell_RING_PERPETUAL;
    hostiles_pursue(state);
  }
}